

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

bool selective_repeat_new_create_line_allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value *param_3)

{
  ulong uVar1;
  Am_Object local_30;
  Am_Object orig_line;
  Am_Value *param_2_local;
  Am_Value *new_selection_local;
  Am_Object *command_obj_local;
  
  orig_line.data = (Am_Object_Data *)param_3;
  uVar1 = Am_Value::Valid();
  if (((uVar1 & 1) == 0) || (new_selection->type != 0xa001)) {
    command_obj_local._7_1_ = false;
  }
  else {
    Am_Object::Am_Object(&local_30,(Am_Value *)new_selection);
    command_obj_local._7_1_ = internal_selective_repeat_create_line_allowed(command_obj,&local_30);
    Am_Object::~Am_Object(&local_30);
  }
  return command_obj_local._7_1_;
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
		 selective_repeat_new_create_line_allowed,
		 (Am_Object command_obj, Am_Value new_selection,
		  Am_Value /* new_value */)) {
  if (new_selection.Valid() && new_selection.type == Am_OBJECT) {
    Am_Object orig_line = new_selection;
    return internal_selective_repeat_create_line_allowed(command_obj,
							 orig_line);
  }
  return false;
}